

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<kj::AuthenticatedStream> __thiscall
kj::ConnectionReceiver::acceptAuthenticated(ConnectionReceiver *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  PromiseArenaMember *in_RAX;
  void *pvVar3;
  undefined8 *in_RSI;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_28;
  
  local_28.ptr = (PromiseNode *)in_RAX;
  (**(code **)*in_RSI)(&local_28);
  OVar2.ptr = local_28.ptr;
  pPVar1 = ((local_28.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_28.ptr - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_28,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:3288:24)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_006491c8;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    ((local_28.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&local_28.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_28,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:3288:24)>
               ::anon_class_1_0_00000001_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006491c8;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  OVar2.ptr = local_28.ptr;
  this->_vptr_ConnectionReceiver = (_func_int **)this_00;
  if (&(local_28.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_28.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> ConnectionReceiver::acceptAuthenticated() {
  return accept().then([](Own<AsyncIoStream> stream) {
    return AuthenticatedStream { kj::mv(stream), UnknownPeerIdentity::newInstance() };
  });
}